

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::add(Solver *this,ClauseRep *c,bool isNew)

{
  size_type sVar1;
  ExtendedStats *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint64 in_RAX;
  uint32 flags;
  Status SVar5;
  Literal p;
  Result RVar6;
  Antecedent local_28;
  
  if ((int)*(uint *)&c->field_0x4 < 0) {
    uVar3 = *(uint *)&c->field_0x4 & 0x7fffffff;
    if (uVar3 < 2) {
      if (uVar3 == 0) {
        p.rep_ = 2;
      }
      else {
        p.rep_ = c->lits->rep_;
      }
      sVar1 = (this->assign_).trail.ebo_.size;
      local_28.data_ = 2;
      force(this,p,0,&local_28,0xffffffff);
      bVar2 = sVar1 != (this->assign_).trail.ebo_.size;
    }
    else {
      local_28.data_ = in_RAX;
      bVar2 = allowImplicit(this,c);
      if (!bVar2) {
        flags = 2;
        goto LAB_00168313;
      }
      iVar4 = SharedContext::addImp
                        (this->shared_,*(ImpType *)&c->field_0x4 & 0x7fffffff,c->lits,
                         (c->info).super_ConstraintScore.rep >> 0x1c & Other);
      bVar2 = 0 < iVar4;
    }
    if (((isNew & bVar2) == 1) &&
       (uVar3 = (c->info).super_ConstraintScore.rep, (uVar3 & 0x30000000) != 0)) {
      this_00 = (this->stats).extra;
      if (this_00 != (ExtendedStats *)0x0) {
        ExtendedStats::addLearnt(this_00,*(uint *)&c->field_0x4 & 0x7fffffff,uVar3 >> 0x1c & Other);
      }
      distribute(this,c->lits,*(uint *)&c->field_0x4 & 0x7fffffff,&c->info);
    }
    SVar5 = (this->conflict_).ebo_.size;
  }
  else {
    flags = 0x100;
LAB_00168313:
    RVar6 = ClauseCreator::create(this,c,flags);
    SVar5 = RVar6.status & status_unsat;
  }
  return SVar5 == status_open;
}

Assistant:

bool Solver::add(const ClauseRep& c, bool isNew) {
	typedef ShortImplicationsGraph::ImpType ImpType;
	if (c.prep == 0) {
		return ClauseCreator::create(*this, c, ClauseCreator::clause_force_simplify).ok();
	}
	int added = 0;
	if (c.size > 1) {
		if (allowImplicit(c)) { added = shared_->addImp(static_cast<ImpType>(c.size), c.lits, c.info.type()); }
		else                  { return ClauseCreator::create(*this, c, ClauseCreator::clause_explicit).ok(); }
	}
	else {
		Literal u = c.size ? c.lits[0] : lit_false();
		uint32  ts= sizeVec(trail());
		force(u);
		added     = int(ts != trail().size());
	}
	if (added > 0 && isNew && c.info.learnt()) {
		stats.addLearnt(c.size, c.info.type());
		distribute(c.lits, c.size, c.info);
	}
	return !hasConflict();
}